

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<CPP::WriteInitialization::Buddy>::copyAppend
          (QGenericArrayOps<CPP::WriteInitialization::Buddy> *this,Buddy *b,Buddy *e)

{
  qsizetype *pqVar1;
  Buddy *pBVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pBVar2 = (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).size;
      pDVar4 = (b->labelVarName).d.d;
      pBVar2[lVar3].labelVarName.d.d = pDVar4;
      pBVar2[lVar3].labelVarName.d.ptr = (b->labelVarName).d.ptr;
      pBVar2[lVar3].labelVarName.d.size = (b->labelVarName).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar4 = (b->buddyAttributeName).d.d;
      pBVar2[lVar3].buddyAttributeName.d.d = pDVar4;
      pBVar2[lVar3].buddyAttributeName.d.ptr = (b->buddyAttributeName).d.ptr;
      pBVar2[lVar3].buddyAttributeName.d.size = (b->buddyAttributeName).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }